

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

string * __thiscall amrex::ParmParse::PP_entry::print_abi_cxx11_(PP_entry *this)

{
  ostream *poVar1;
  size_type sVar2;
  const_reference pvVar3;
  string *in_RSI;
  string *in_RDI;
  int i;
  int n;
  stringstream t;
  int local_1ac;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,in_RSI);
  std::operator<<(poVar1," = ");
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0x20));
  for (local_1ac = 0; local_1ac < (int)sVar2; local_1ac = local_1ac + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RSI + 0x20),(long)local_1ac);
    std::operator<<(local_188,(string *)pvVar3);
    if (local_1ac < (int)sVar2 + -1) {
      std::operator<<(local_188," ");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string
ParmParse::PP_entry::print () const {
    std::stringstream t;
    t << m_name << " = ";
    int n = m_vals.size();
    for ( int i = 0; i < n; i++)
    {
        t << m_vals[i];
        if ( i < n-1 ) t << " ";
    }
    return t.str();
}